

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  vfloat<4> vVar2;
  BVH *bvh;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  size_t sVar9;
  byte bVar10;
  bool bVar11;
  long lVar12;
  undefined4 uVar13;
  size_t sVar14;
  NodeRef *pNVar15;
  NodeRef root;
  long lVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar21;
  byte bVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  int iVar46;
  int iVar47;
  vint4 ai_2;
  vint4 bi;
  vint4 bi_1;
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  vint4 ai;
  vint4 bi_2;
  vint4 ai_1;
  vint4 ai_3;
  undefined1 auVar48 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar49;
  undefined1 auVar50 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint local_185c;
  Precalculations pre;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar26 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar29 = ZEXT816(0) << 0x40;
    uVar6 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29,5);
    uVar23 = vpcmpeqd_avx512vl(auVar26,(undefined1  [16])valid_i->field_0);
    uVar23 = ((byte)uVar6 & 0xf) & uVar23;
    bVar22 = (byte)uVar23;
    if (bVar22 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx(auVar28,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar24._8_4_ = 0x219392ef;
      auVar24._0_8_ = 0x219392ef219392ef;
      auVar24._12_4_ = 0x219392ef;
      uVar7 = vcmpps_avx512vl(auVar26,auVar24,1);
      bVar11 = (bool)((byte)uVar7 & 1);
      auVar25._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._0_4_;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._4_4_;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._8_4_;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar25._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._12_4_;
      auVar26 = vandps_avx(auVar28,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar7 = vcmpps_avx512vl(auVar26,auVar24,1);
      bVar11 = (bool)((byte)uVar7 & 1);
      auVar31._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._16_4_;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar31._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._20_4_;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar31._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._24_4_;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar31._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._28_4_;
      auVar26 = vandps_avx(auVar28,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar7 = vcmpps_avx512vl(auVar26,auVar24,1);
      bVar11 = (bool)((byte)uVar7 & 1);
      auVar32._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._32_4_;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar32._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._36_4_;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar32._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._40_4_;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar32._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._44_4_;
      auVar24 = vrcp14ps_avx512vl(auVar25);
      auVar27._8_4_ = 0x3f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar27._12_4_ = 0x3f800000;
      auVar26 = vfnmadd213ps_fma(auVar25,auVar24,auVar27);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar26,auVar24,auVar24)
      ;
      auVar25 = vrcp14ps_avx512vl(auVar31);
      auVar26 = vfnmadd213ps_fma(auVar31,auVar25,auVar27);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar26,auVar25,auVar25)
      ;
      auVar25 = vrcp14ps_avx512vl(auVar32);
      auVar26 = vfnmadd213ps_fma(auVar32,auVar25,auVar27);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar26,auVar25,auVar25)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      uVar7 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar29,1);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar26._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar7 & 1) * auVar26._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar26._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar26._12_4_;
      uVar7 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar29,5);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar11 = (bool)((byte)uVar7 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar11 * auVar26._0_4_ | (uint)!bVar11 * 0x30;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar11 * auVar26._4_4_ | (uint)!bVar11 * 0x30;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar11 * auVar26._8_4_ | (uint)!bVar11 * 0x30;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar11 * auVar26._12_4_ | (uint)!bVar11 * 0x30;
      uVar7 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar29,5);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar11 = (bool)((byte)uVar7 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar11 * auVar26._0_4_ | (uint)!bVar11 * 0x50;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar11 * auVar26._4_4_ | (uint)!bVar11 * 0x50;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar11 * auVar26._8_4_ | (uint)!bVar11 * 0x50;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar11 * auVar26._12_4_ | (uint)!bVar11 * 0x50;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar50 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar26 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar29);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar22 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar22 & 1) * 0x7f800000;
      bVar11 = (bool)((byte)(uVar23 >> 1) & 1);
      tray.tnear.field_0._4_4_ = (uint)bVar11 * auVar26._4_4_ | (uint)!bVar11 * 0x7f800000;
      bVar11 = (bool)((byte)(uVar23 >> 2) & 1);
      tray.tnear.field_0._8_4_ = (uint)bVar11 * auVar26._8_4_ | (uint)!bVar11 * 0x7f800000;
      bVar11 = SUB81(uVar23 >> 3,0);
      tray.tnear.field_0._12_4_ = (uint)bVar11 * auVar26._12_4_ | (uint)!bVar11 * 0x7f800000;
      auVar26 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29);
      tray.tfar.field_0.i[0] =
           (uint)(bVar22 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar22 & 1) * -0x800000;
      bVar11 = (bool)((byte)(uVar23 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar11 * auVar26._4_4_ | (uint)!bVar11 * -0x800000;
      bVar11 = (bool)((byte)(uVar23 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar11 * auVar26._8_4_ | (uint)!bVar11 * -0x800000;
      bVar11 = SUB81(uVar23 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar11 * auVar26._12_4_ | (uint)!bVar11 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar20 = 3;
      }
      else {
        uVar20 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_185c = (ushort)uVar23 ^ 0xf;
      pNVar15 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar21 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_01c92f47:
      do {
        do {
          root.ptr = pNVar15[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01c936d6;
          pNVar15 = pNVar15 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21[-1].v;
          auVar53 = ZEXT1664((undefined1  [16])vVar2.field_0);
          paVar21 = paVar21 + -1;
          uVar23 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar23 == '\0');
        uVar13 = (undefined4)uVar23;
        if (uVar20 < (uint)POPCOUNT(uVar13)) {
LAB_01c92f8d:
          do {
            aVar49 = auVar50._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01c936d6;
              uVar6 = vcmpps_avx512vl((undefined1  [16])tray.tfar.field_0,auVar53._0_16_,6);
              if ((char)uVar6 == '\0') goto LAB_01c92f47;
              bVar10 = ~(byte)local_185c & 0xf;
              auVar26 = *(undefined1 (*) [16])(ray + 0x50);
              auVar29 = *(undefined1 (*) [16])(ray + 0x60);
              auVar25 = *(undefined1 (*) [16])(ray + 0x40);
              lVar16 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              lVar12 = 0;
              goto LAB_01c9318d;
            }
            sVar14 = 8;
            aVar51 = aVar49;
            for (lVar12 = 0;
                (auVar53 = ZEXT1664((undefined1  [16])aVar51), lVar12 != 4 &&
                (sVar3 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar12 * 8), sVar3 != 8));
                lVar12 = lVar12 + 1) {
              uVar13 = *(undefined4 *)(root.ptr + 0x20 + lVar12 * 4);
              auVar43._4_4_ = uVar13;
              auVar43._0_4_ = uVar13;
              auVar43._8_4_ = uVar13;
              auVar43._12_4_ = uVar13;
              auVar25 = vfmsub132ps_fma(auVar43,(undefined1  [16])
                                                tray.org_rdir.field_0.field_0.x.field_0,
                                        (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
              auVar40._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar40._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar40._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar40._12_4_ = tray.org_rdir.field_0._28_4_;
              uVar13 = *(undefined4 *)(root.ptr + 0x40 + lVar12 * 4);
              auVar44._4_4_ = uVar13;
              auVar44._0_4_ = uVar13;
              auVar44._8_4_ = uVar13;
              auVar44._12_4_ = uVar13;
              auVar42._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar42._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar42._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar42._12_4_ = tray.org_rdir.field_0._44_4_;
              uVar13 = *(undefined4 *)(root.ptr + 0x60 + lVar12 * 4);
              auVar48._4_4_ = uVar13;
              auVar48._0_4_ = uVar13;
              auVar48._8_4_ = uVar13;
              auVar48._12_4_ = uVar13;
              auVar31 = vfmsub132ps_fma(auVar44,auVar40,
                                        (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar32 = vfmsub132ps_fma(auVar48,auVar42,
                                        (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              uVar13 = *(undefined4 *)(root.ptr + 0x30 + lVar12 * 4);
              auVar26._4_4_ = uVar13;
              auVar26._0_4_ = uVar13;
              auVar26._8_4_ = uVar13;
              auVar26._12_4_ = uVar13;
              auVar24 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                   (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0,auVar26
                                  );
              uVar13 = *(undefined4 *)(root.ptr + 0x50 + lVar12 * 4);
              auVar29._4_4_ = uVar13;
              auVar29._0_4_ = uVar13;
              auVar29._8_4_ = uVar13;
              auVar29._12_4_ = uVar13;
              auVar27 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar40,
                                   auVar29);
              uVar13 = *(undefined4 *)(root.ptr + 0x70 + lVar12 * 4);
              auVar39._4_4_ = uVar13;
              auVar39._0_4_ = uVar13;
              auVar39._8_4_ = uVar13;
              auVar39._12_4_ = uVar13;
              auVar28 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar42,
                                   auVar39);
              auVar26 = vpminsd_avx(auVar25,auVar24);
              auVar29 = vpminsd_avx(auVar31,auVar27);
              auVar26 = vpmaxsd_avx(auVar26,auVar29);
              auVar29 = vpminsd_avx(auVar32,auVar28);
              auVar26 = vpmaxsd_avx(auVar26,auVar29);
              auVar29 = vpmaxsd_avx(auVar25,auVar24);
              auVar25 = vpmaxsd_avx(auVar31,auVar27);
              auVar25 = vpminsd_avx(auVar29,auVar25);
              auVar29 = vpmaxsd_avx(auVar32,auVar28);
              auVar25 = vpminsd_avx(auVar25,auVar29);
              auVar29 = vpmaxsd_avx(auVar26,(undefined1  [16])tray.tnear.field_0);
              auVar25 = vpminsd_avx(auVar25,(undefined1  [16])tray.tfar.field_0);
              uVar23 = vpcmpd_avx512vl(auVar29,auVar25,2);
              uVar23 = uVar23 & 0xf;
              sVar9 = sVar14;
              aVar30 = aVar51;
              if ((byte)uVar23 != 0) {
                auVar29 = vblendmps_avx512vl((undefined1  [16])aVar49,auVar26);
                bVar11 = (bool)((byte)uVar23 & 1);
                aVar30._0_4_ = (uint)bVar11 * auVar29._0_4_ | (uint)!bVar11 * auVar26._0_4_;
                bVar11 = (bool)((byte)(uVar23 >> 1) & 1);
                aVar30._4_4_ = (uint)bVar11 * auVar29._4_4_ | (uint)!bVar11 * auVar26._4_4_;
                bVar11 = (bool)((byte)(uVar23 >> 2) & 1);
                aVar30._8_4_ = (uint)bVar11 * auVar29._8_4_ | (uint)!bVar11 * auVar26._8_4_;
                bVar11 = SUB81(uVar23 >> 3,0);
                aVar30._12_4_ = (uint)bVar11 * auVar29._12_4_ | (uint)!bVar11 * auVar26._12_4_;
                sVar9 = sVar3;
                if (sVar14 != 8) {
                  pNVar15->ptr = sVar14;
                  pNVar15 = pNVar15 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21->v = aVar51;
                  paVar21 = paVar21 + 1;
                }
              }
              aVar51 = aVar30;
              sVar14 = sVar9;
            }
            if (sVar14 == 8) goto LAB_01c930ee;
            uVar6 = vcmpps_avx512vl((undefined1  [16])aVar51,(undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar14;
          } while ((byte)uVar20 < (byte)POPCOUNT((int)uVar6));
          pNVar15->ptr = sVar14;
          pNVar15 = pNVar15 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21->v = aVar51;
          paVar21 = paVar21 + 1;
LAB_01c930ee:
          iVar45 = 4;
        }
        else {
          while (uVar23 != 0) {
            sVar14 = 0;
            for (uVar7 = uVar23; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
              sVar14 = sVar14 + 1;
            }
            uVar23 = uVar23 - 1 & uVar23;
            bVar11 = occluded1(This,bvh,root,sVar14,&pre,ray,&tray,context);
            bVar10 = (byte)(1 << ((uint)sVar14 & 0x1f));
            if (!bVar11) {
              bVar10 = 0;
            }
            local_185c = (uint)((byte)local_185c | bVar10);
          }
          iVar45 = 3;
          auVar50 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar53 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if ((byte)local_185c != 0xf) {
            auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_185c & 1) * auVar26._0_4_ |
                 (uint)!(bool)((byte)local_185c & 1) * tray.tfar.field_0.i[0];
            bVar11 = (bool)((byte)(local_185c >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar11 * auVar26._4_4_ | (uint)!bVar11 * tray.tfar.field_0.i[1];
            bVar11 = (bool)((byte)(local_185c >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar11 * auVar26._8_4_ | (uint)!bVar11 * tray.tfar.field_0.i[2];
            bVar11 = (bool)((byte)(local_185c >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar11 * auVar26._12_4_ | (uint)!bVar11 * tray.tfar.field_0.i[3];
            iVar45 = 2;
          }
          if (uVar20 < (uint)POPCOUNT(uVar13)) goto LAB_01c92f8d;
        }
      } while (iVar45 != 3);
LAB_01c936d6:
      local_185c._0_1_ = (byte)local_185c & bVar22;
      bVar11 = (bool)((byte)local_185c >> 1 & 1);
      bVar4 = (bool)((byte)local_185c >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)((byte)local_185c & 1) * -0x800000 |
           (uint)!(bool)((byte)local_185c & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar11 * -0x800000 | (uint)!bVar11 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)((byte)local_185c >> 3) * -0x800000 |
           (uint)!(bool)((byte)local_185c >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
LAB_01c9318d:
  do {
    if (lVar12 == (ulong)((uint)root.ptr & 0xf) - 8) goto LAB_01c935c4;
    lVar17 = -0x10;
    bVar19 = bVar10;
    do {
      if ((lVar17 == 0) || (uVar23 = (ulong)*(uint *)(lVar16 + 0x10 + lVar17), uVar23 == 0xffffffff)
         ) goto LAB_01c935af;
      auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar16 + -0xb0 + lVar17)));
      auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar16 + -0xa0 + lVar17)));
      auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar16 + -0x90 + lVar17)));
      uVar13 = *(undefined4 *)(lVar16 + -0x80 + lVar17);
      auVar52._4_4_ = uVar13;
      auVar52._0_4_ = uVar13;
      auVar52._8_4_ = uVar13;
      auVar52._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(lVar16 + -0x70 + lVar17);
      auVar54._4_4_ = uVar13;
      auVar54._0_4_ = uVar13;
      auVar54._8_4_ = uVar13;
      auVar54._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(lVar16 + -0x60 + lVar17);
      auVar55._4_4_ = uVar13;
      auVar55._0_4_ = uVar13;
      auVar55._8_4_ = uVar13;
      auVar55._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(lVar16 + -0x20 + lVar17);
      auVar56._4_4_ = uVar13;
      auVar56._0_4_ = uVar13;
      auVar56._8_4_ = uVar13;
      auVar56._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(lVar16 + -0x10 + lVar17);
      auVar58._4_4_ = uVar13;
      auVar58._0_4_ = uVar13;
      auVar58._8_4_ = uVar13;
      auVar58._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(lVar16 + lVar17);
      auVar59._4_4_ = uVar13;
      auVar59._0_4_ = uVar13;
      auVar59._8_4_ = uVar13;
      auVar59._12_4_ = uVar13;
      auVar27 = vsubss_avx512f(auVar31,auVar52);
      auVar28 = vbroadcastss_avx512vl(auVar27);
      auVar33 = vsubss_avx512f(auVar32,auVar54);
      auVar34 = vbroadcastss_avx512vl(auVar33);
      auVar35 = vsubss_avx512f(auVar24,auVar55);
      auVar36 = vbroadcastss_avx512vl(auVar35);
      auVar37 = vsubss_avx512f(auVar56,auVar31);
      auVar38 = vbroadcastss_avx512vl(auVar37);
      auVar39 = vsubss_avx512f(auVar58,auVar32);
      auVar40 = vbroadcastss_avx512vl(auVar39);
      auVar41 = vsubss_avx512f(auVar59,auVar24);
      auVar42 = vbroadcastss_avx512vl(auVar41);
      auVar33 = vmulss_avx512f(auVar33,auVar41);
      auVar33 = vbroadcastss_avx512vl(auVar33);
      auVar41 = vfmsub231ps_avx512vl(auVar33,auVar40,auVar36);
      auVar33 = vmulss_avx512f(auVar35,auVar37);
      auVar33 = vbroadcastss_avx512vl(auVar33);
      auVar35 = vfmsub231ps_avx512vl(auVar33,auVar42,auVar28);
      auVar27 = vmulss_avx512f(auVar27,auVar39);
      auVar27 = vbroadcastss_avx512vl(auVar27);
      auVar27 = vfmsub231ps_avx512vl(auVar27,auVar38,auVar34);
      auVar31 = vsubps_avx512vl(auVar31,*(undefined1 (*) [16])ray);
      auVar32 = vsubps_avx512vl(auVar32,*(undefined1 (*) [16])(ray + 0x10));
      auVar24 = vsubps_avx512vl(auVar24,*(undefined1 (*) [16])(ray + 0x20));
      auVar33 = vmulps_avx512vl(auVar26,auVar24);
      auVar37 = vfmsub231ps_avx512vl(auVar33,auVar32,auVar29);
      auVar33 = vmulps_avx512vl(auVar29,auVar31);
      auVar39 = vfmsub231ps_avx512vl(auVar33,auVar24,auVar25);
      auVar33 = vmulps_avx512vl(auVar25,auVar32);
      auVar43 = vfmsub231ps_avx512vl(auVar33,auVar31,auVar26);
      auVar33 = vmulps_avx512vl(auVar27,auVar29);
      auVar33 = vfmadd231ps_avx512vl(auVar33,auVar35,auVar26);
      auVar44 = vfmadd231ps_avx512vl(auVar33,auVar41,auVar25);
      auVar33._8_4_ = 0x80000000;
      auVar33._0_8_ = 0x8000000080000000;
      auVar33._12_4_ = 0x80000000;
      auVar33 = vandps_avx512vl(auVar44,auVar33);
      auVar42 = vmulps_avx512vl(auVar42,auVar43);
      auVar40 = vfmadd231ps_avx512vl(auVar42,auVar39,auVar40);
      auVar38 = vfmadd231ps_avx512vl(auVar40,auVar37,auVar38);
      auVar38 = vxorps_avx512vl(auVar33,auVar38);
      uVar6 = vcmpps_avx512vl(auVar38,_DAT_01f45a50,5);
      bVar18 = (byte)uVar6 & bVar19;
      if (bVar18 != 0) {
        auVar36 = vmulps_avx512vl(auVar36,auVar43);
        auVar34 = vfmadd213ps_avx512vl(auVar34,auVar39,auVar36);
        auVar28 = vfmadd213ps_avx512vl(auVar28,auVar37,auVar34);
        auVar28 = vxorps_avx512vl(auVar33,auVar28);
        uVar6 = vcmpps_avx512vl(auVar28,_DAT_01f45a50,5);
        bVar18 = bVar18 & (byte)uVar6;
        if (bVar18 != 0) {
          auVar34._8_4_ = 0x7fffffff;
          auVar34._0_8_ = 0x7fffffff7fffffff;
          auVar34._12_4_ = 0x7fffffff;
          auVar34 = vandps_avx512vl(auVar44,auVar34);
          auVar36 = vsubps_avx512vl(auVar34,auVar38);
          uVar6 = vcmpps_avx512vl(auVar36,auVar28,5);
          bVar18 = bVar18 & (byte)uVar6;
          if (bVar18 != 0) {
            auVar24 = vmulps_avx512vl(auVar27,auVar24);
            auVar32 = vfmadd213ps_avx512vl(auVar32,auVar35,auVar24);
            auVar31 = vfmadd213ps_avx512vl(auVar31,auVar41,auVar32);
            auVar31 = vxorps_avx512vl(auVar33,auVar31);
            auVar32 = vmulps_avx512vl(auVar34,*(undefined1 (*) [16])(ray + 0x30));
            auVar24 = vmulps_avx512vl(auVar34,*(undefined1 (*) [16])(ray + 0x80));
            uVar6 = vcmpps_avx512vl(auVar31,auVar24,2);
            uVar8 = vcmpps_avx512vl(auVar32,auVar31,1);
            bVar18 = bVar18 & (byte)uVar6 & (byte)uVar8;
            if (bVar18 != 0) {
              uVar6 = vcmpps_avx512vl(auVar44,_DAT_01f45a50,4);
              bVar18 = bVar18 & (byte)uVar6;
              if (bVar18 != 0) {
                uVar1 = ((context->scene->geometries).items[uVar23].ptr)->mask;
                auVar35._4_4_ = uVar1;
                auVar35._0_4_ = uVar1;
                auVar35._8_4_ = uVar1;
                auVar35._12_4_ = uVar1;
                uVar6 = vptestmd_avx512vl(*(undefined1 (*) [16])(ray + 0x90),auVar35);
                bVar18 = bVar18 & (byte)uVar6 & 0xf;
                if (bVar18 != 0) {
                  bVar19 = (bVar18 ^ 0xf) & bVar19;
                }
              }
            }
          }
        }
      }
      if (bVar19 == 0) break;
      uVar13 = *(undefined4 *)(lVar16 + -0x50 + lVar17);
      auVar41._4_4_ = uVar13;
      auVar41._0_4_ = uVar13;
      auVar41._8_4_ = uVar13;
      auVar41._12_4_ = uVar13;
      auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar16 + -0x40 + lVar17)));
      auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar16 + -0x30 + lVar17)));
      auVar27 = vsubps_avx512vl(auVar41,auVar56);
      auVar28 = vsubps_avx512vl(auVar32,auVar58);
      auVar33 = vsubps_avx512vl(auVar24,auVar59);
      auVar34 = vsubps_avx512vl(auVar52,auVar41);
      auVar35 = vsubps_avx512vl(auVar54,auVar32);
      auVar37 = vsubps_avx512vl(auVar55,auVar24);
      auVar31 = vmulps_avx512vl(auVar28,auVar37);
      auVar38 = vfmsub231ps_avx512vl(auVar31,auVar35,auVar33);
      auVar31 = vmulps_avx512vl(auVar33,auVar34);
      auVar39 = vfmsub231ps_avx512vl(auVar31,auVar37,auVar27);
      auVar31 = vmulps_avx512vl(auVar27,auVar35);
      auVar40 = vfmsub231ps_avx512vl(auVar31,auVar34,auVar28);
      auVar31 = vsubps_avx(auVar41,*(undefined1 (*) [16])ray);
      auVar41 = vsubps_avx512vl(auVar32,*(undefined1 (*) [16])(ray + 0x10));
      auVar24 = vsubps_avx512vl(auVar24,*(undefined1 (*) [16])(ray + 0x20));
      auVar32 = vmulps_avx512vl(auVar26,auVar24);
      auVar42 = vfmsub231ps_avx512vl(auVar32,auVar41,auVar29);
      auVar32 = vmulps_avx512vl(auVar29,auVar31);
      auVar43 = vfmsub231ps_avx512vl(auVar32,auVar24,auVar25);
      auVar32 = vmulps_avx512vl(auVar25,auVar41);
      auVar44 = vfmsub231ps_avx512vl(auVar32,auVar31,auVar26);
      auVar57._0_4_ = auVar40._0_4_ * auVar29._0_4_;
      auVar57._4_4_ = auVar40._4_4_ * auVar29._4_4_;
      auVar57._8_4_ = auVar40._8_4_ * auVar29._8_4_;
      auVar57._12_4_ = auVar40._12_4_ * auVar29._12_4_;
      auVar32 = vfmadd231ps_fma(auVar57,auVar39,auVar26);
      auVar32 = vfmadd231ps_fma(auVar32,auVar38,auVar25);
      auVar36._8_4_ = 0x80000000;
      auVar36._0_8_ = 0x8000000080000000;
      auVar36._12_4_ = 0x80000000;
      auVar36 = vandps_avx512vl(auVar32,auVar36);
      auVar37 = vmulps_avx512vl(auVar37,auVar44);
      auVar35 = vfmadd231ps_avx512vl(auVar37,auVar43,auVar35);
      auVar34 = vfmadd231ps_avx512vl(auVar35,auVar42,auVar34);
      auVar34 = vxorps_avx512vl(auVar36,auVar34);
      uVar6 = vcmpps_avx512vl(auVar34,_DAT_01f45a50,5);
      bVar18 = (byte)uVar6 & bVar19;
      if (bVar18 != 0) {
        auVar33 = vmulps_avx512vl(auVar33,auVar44);
        auVar28 = vfmadd213ps_avx512vl(auVar28,auVar43,auVar33);
        auVar27 = vfmadd213ps_avx512vl(auVar27,auVar42,auVar28);
        auVar27 = vxorps_avx512vl(auVar36,auVar27);
        uVar6 = vcmpps_avx512vl(auVar27,_DAT_01f45a50,5);
        bVar18 = bVar18 & (byte)uVar6;
        if (bVar18 != 0) {
          auVar37._8_4_ = 0x7fffffff;
          auVar37._0_8_ = 0x7fffffff7fffffff;
          auVar37._12_4_ = 0x7fffffff;
          auVar28 = vandps_avx512vl(auVar32,auVar37);
          auVar33 = vsubps_avx512vl(auVar28,auVar34);
          uVar6 = vcmpps_avx512vl(auVar33,auVar27,5);
          bVar18 = bVar18 & (byte)uVar6;
          if (bVar18 != 0) {
            auVar24 = vmulps_avx512vl(auVar40,auVar24);
            auVar24 = vfmadd213ps_fma(auVar41,auVar39,auVar24);
            auVar31 = vfmadd213ps_fma(auVar31,auVar38,auVar24);
            auVar31 = vxorps_avx512vl(auVar36,auVar31);
            auVar24 = vmulps_avx512vl(auVar28,*(undefined1 (*) [16])(ray + 0x30));
            auVar27 = vmulps_avx512vl(auVar28,*(undefined1 (*) [16])(ray + 0x80));
            uVar6 = vcmpps_avx512vl(auVar31,auVar27,2);
            uVar8 = vcmpps_avx512vl(auVar24,auVar31,1);
            bVar18 = bVar18 & (byte)uVar6 & (byte)uVar8;
            if (bVar18 != 0) {
              uVar6 = vcmpps_avx512vl(auVar32,_DAT_01f45a50,4);
              bVar18 = bVar18 & (byte)uVar6;
              if (bVar18 != 0) {
                uVar1 = ((context->scene->geometries).items[uVar23].ptr)->mask;
                auVar38._4_4_ = uVar1;
                auVar38._0_4_ = uVar1;
                auVar38._8_4_ = uVar1;
                auVar38._12_4_ = uVar1;
                uVar6 = vptestmd_avx512vl(*(undefined1 (*) [16])(ray + 0x90),auVar38);
                bVar18 = bVar18 & (byte)uVar6 & 0xf;
                if (bVar18 != 0) {
                  bVar19 = (bVar18 ^ 0xf) & bVar19;
                }
              }
            }
          }
        }
      }
      lVar17 = lVar17 + 4;
    } while (bVar19 != 0);
    bVar19 = 0;
LAB_01c935af:
    lVar12 = lVar12 + 1;
    lVar16 = lVar16 + 0xe0;
    bVar10 = bVar10 & bVar19;
  } while (bVar10 != 0);
  bVar10 = 0;
LAB_01c935c4:
  bVar10 = (byte)local_185c | ~bVar10 & 0xf;
  local_185c = (uint)bVar10;
  if (bVar10 == 0xf) {
    local_185c._0_1_ = 0xf;
    goto LAB_01c936d6;
  }
  auVar50 = ZEXT1664((undefined1  [16])aVar49);
  auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  iVar45 = tray.tfar.field_0._0_4_;
  bVar11 = (bool)(bVar10 >> 1 & 1);
  bVar4 = (bool)(bVar10 >> 2 & 1);
  iVar46 = tray.tfar.field_0._8_4_;
  bVar5 = (bool)(bVar10 >> 3 & 1);
  iVar47 = tray.tfar.field_0._12_4_;
  tray.tfar.field_0.i[1] = (uint)bVar11 * auVar26._4_4_ | (uint)!bVar11 * tray.tfar.field_0._4_4_;
  tray.tfar.field_0.i[0] = (uint)(bVar10 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar10 & 1) * iVar45;
  tray.tfar.field_0.i[2] = (uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * iVar46;
  tray.tfar.field_0.i[3] = (uint)bVar5 * auVar26._12_4_ | (uint)!bVar5 * iVar47;
  goto LAB_01c92f47;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }